

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

void cJSON_Delete(cJSON *c)

{
  cJSON *pcVar1;
  uint uVar2;
  
  if (c != (cJSON *)0x0) {
    do {
      pcVar1 = c->next;
      uVar2 = c->type;
      if (((uVar2 >> 8 & 1) == 0) && (c->child != (cJSON *)0x0)) {
        cJSON_Delete(c->child);
        uVar2 = c->type;
      }
      if (((uVar2 >> 8 & 1) == 0) && (c->valuestring != (char *)0x0)) {
        (*cJSON_free)(c->valuestring);
      }
      if (c->string != (char *)0x0) {
        (*cJSON_free)(c->string);
      }
      (*cJSON_free)(c);
      c = pcVar1;
    } while (pcVar1 != (cJSON *)0x0);
  }
  return;
}

Assistant:

void
cJSON_Delete(cJSON *c)
{
    cJSON *next;
    while (c) {
        next = c->next;
        if (!(c->type & cJSON_IsReference) && c->child)
            cJSON_Delete(c->child);
        if (!(c->type & cJSON_IsReference) && c->valuestring)
            cJSON_free(c->valuestring);
        if (c->string)
            cJSON_free(c->string);
        cJSON_free(c);
        c = next;
    }
}